

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

int luaO_str2d(char *s,size_t len,lua_Number *result)

{
  char *pcVar1;
  lua_Number lVar2;
  double dVar3;
  byte *local_30;
  char *endptr;
  lua_Number *result_local;
  size_t len_local;
  char *s_local;
  
  endptr = (char *)result;
  result_local = (lua_Number *)len;
  len_local = (size_t)s;
  pcVar1 = strpbrk(s,"nN");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = strpbrk((char *)len_local,"xX");
    if (pcVar1 == (char *)0x0) {
      dVar3 = strtod((char *)len_local,(char **)&local_30);
      *(double *)endptr = dVar3;
    }
    else {
      lVar2 = lua_strx2number((char *)len_local,(char **)&local_30);
      *(lua_Number *)endptr = lVar2;
    }
    if (local_30 == (byte *)len_local) {
      s_local._4_4_ = 0;
    }
    else {
      while ((""[(int)(*local_30 + 1)] & 8) != 0) {
        local_30 = local_30 + 1;
      }
      s_local._4_4_ = (uint)(local_30 == (byte *)(len_local + (long)result_local));
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

int luaO_str2d (const char *s, size_t len, lua_Number *result) {
  char *endptr;
  if (strpbrk(s, "nN"))  /* reject 'inf' and 'nan' */
    return 0;
  else if (strpbrk(s, "xX"))  /* hexa? */
    *result = lua_strx2number(s, &endptr);
  else
    *result = lua_str2number(s, &endptr);
  if (endptr == s) return 0;  /* nothing recognized */
  while (lisspace(cast_uchar(*endptr))) endptr++;
  return (endptr == s + len);  /* OK if no trailing characters */
}